

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

void lyext_log(ly_ctx *ctx,LY_LOG_LEVEL level,char *plugin,char *function,char *format,...)

{
  char in_AL;
  int iVar1;
  LY_ERR no;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [40];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 local_38 [8];
  va_list ap;
  char *plugin_msg;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (level <= ly_log_level) {
    local_c0 = in_R9;
    if (plugin == (char *)0x0) {
      iVar1 = asprintf((char **)&ap[0].reg_save_area,"%s",format,0);
    }
    else {
      iVar1 = asprintf((char **)&ap[0].reg_save_area,"%s (reported by plugin %s, %s())",format,
                       plugin);
    }
    if (iVar1 == -1) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyext_log");
    }
    else {
      ap[0].overflow_arg_area = local_e8;
      ap[0]._0_8_ = &stack0x00000008;
      local_38._0_4_ = 0x28;
      local_38._4_4_ = 0x30;
      no = LY_EPLUGIN;
      if (level != LY_LLERR) {
        no = LY_SUCCESS;
      }
      log_vprintf(ctx,level,no,LYVE_SUCCESS,(char *)0x0,(char *)ap[0].reg_save_area,
                  (__va_list_tag *)local_38);
      free(ap[0].reg_save_area);
    }
  }
  return;
}

Assistant:

API void
lyext_log(const struct ly_ctx *ctx, LY_LOG_LEVEL level, const char *plugin, const char *function, const char *format, ...)
{
    va_list ap;
    char *plugin_msg;
    int ret;

    if (ly_log_level < level) {
        return;
    }

    if (plugin)
        ret = asprintf(&plugin_msg, "%s (reported by plugin %s, %s())", format, plugin, function);
    else
        ret = asprintf(&plugin_msg, "%s", format);

    if (ret == -1) {
        LOGMEM(ctx);
        return;
    }

    va_start(ap, format);
    log_vprintf(ctx, level, (level == LY_LLERR ? LY_EPLUGIN : 0), 0, NULL, plugin_msg, ap);
    va_end(ap);

    free(plugin_msg);
}